

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-precede.cpp
# Opt level: O1

void __thiscall value_precede::value_precede(value_precede *this,int _s,int _t,vec<IntVar_*> *vs)

{
  vec<IntVar_*> *this_00;
  Tint *pTVar1;
  Tint *pTVar2;
  int iVar3;
  int iVar4;
  IntVar *pIVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  byte bVar9;
  uint uVar10;
  int *pt_1;
  int *pt_2;
  ulong uVar11;
  uint uVar12;
  int *pt;
  uint uVar13;
  Tchar *pTVar14;
  bool bVar15;
  IntVar *x;
  TrailElem local_50;
  uint local_3c;
  Tchar *local_38;
  
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__Propagator_0020fe18;
  (this->super_Propagator).prop_id = engine.propagators.sz;
  (this->super_Propagator).priority = 0;
  (this->super_Propagator).satisfied = '\0';
  (this->super_Propagator).in_queue = false;
  local_50.pt = (int *)this;
  vec<Propagator_*>::push(&engine.propagators,(Propagator **)&local_50);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__value_precede_00210c38;
  *(int *)&(this->super_Propagator).field_0x14 = _s;
  this->t = _t;
  (this->xs).sz = 0;
  (this->xs).cap = 0;
  (this->xs).data = (IntVar **)0x0;
  (this->satisfied).v = '\0';
  uVar10 = 0;
  uVar11 = 0;
  if (vs->sz != 0) {
    uVar11 = 0;
    do {
      pIVar5 = vs->data[uVar11];
      iVar8 = this->t;
      if ((((pIVar5->min).v <= iVar8) && (iVar8 <= (pIVar5->max).v)) &&
         ((pIVar5->vals == (Tchar *)0x0 || (pIVar5->vals[iVar8].v != '\0')))) {
        int_rel(pIVar5,IRT_NE,iVar8);
      }
      pIVar5 = vs->data[uVar11];
      iVar8 = *(int *)&(this->super_Propagator).field_0x14;
    } while ((((iVar8 < (pIVar5->min).v) || ((pIVar5->max).v < iVar8)) ||
             ((pIVar5->vals != (Tchar *)0x0 && (pIVar5->vals[iVar8].v == '\0')))) &&
            (uVar11 = uVar11 + 1, uVar11 < vs->sz));
  }
  this_00 = &this->xs;
  pTVar1 = &this->first_s;
  local_50.x = pTVar1->v;
  local_50.sz = 4;
  local_50.pt = &pTVar1->v;
  vec<TrailElem>::push(&engine.trail,&local_50);
  pTVar1->v = 0;
  if ((uint)uVar11 < vs->sz) {
    uVar11 = uVar11 & 0xffffffff;
    bVar9 = 0;
    do {
      local_50.pt = (int *)vs->data[uVar11];
      iVar8 = (((IntVar *)local_50.pt)->min).v;
      iVar3 = (((IntVar *)local_50.pt)->max).v;
      if ((iVar8 != iVar3) || (bVar15 = true, iVar8 != *(int *)&(this->super_Propagator).field_0x14)
         ) {
        iVar4 = *(int *)&(this->super_Propagator).field_0x14;
        if ((iVar3 < iVar4 || iVar4 < iVar8) ||
           ((((IntVar *)local_50.pt)->vals != (Tchar *)0x0 &&
            (((IntVar *)local_50.pt)->vals[iVar4].v == '\0')))) {
          iVar4 = this->t;
          if ((iVar3 < iVar4 || iVar4 < iVar8) ||
             ((((IntVar *)local_50.pt)->vals != (Tchar *)0x0 &&
              (((IntVar *)local_50.pt)->vals[iVar4].v == '\0')))) {
            bVar15 = false;
            goto LAB_00170b22;
          }
        }
        vec<IntVar_*>::push(this_00,(IntVar **)&local_50);
        iVar8 = ((Tint *)((long)local_50.pt + 0xc))->v;
        bVar6 = iVar8 == this->t;
        bVar7 = ((Tint *)((long)local_50.pt + 0x10))->v == iVar8;
        bVar15 = bVar6 && bVar7;
        if (bVar6 && bVar7) {
          bVar9 = 1;
        }
      }
LAB_00170b22:
    } while ((!bVar15) && (uVar11 = uVar11 + 1, uVar11 < vs->sz));
    uVar10 = (uint)bVar9;
  }
  pTVar14 = &this->satisfied;
  if (1 < this_00->sz) {
    uVar12 = this_00->sz;
    local_38 = pTVar14;
    if (uVar12 != 0) {
      uVar13 = 1;
      uVar11 = 0;
      local_3c = uVar10;
      do {
        pIVar5 = (this->xs).data[uVar11];
        IntVar::specialiseToEL(pIVar5);
        iVar8 = *(int *)&(this->super_Propagator).field_0x14;
        if ((((pIVar5->min).v <= iVar8) && (iVar8 <= (pIVar5->max).v)) &&
           ((pIVar5->vals == (Tchar *)0x0 || (pIVar5->vals[iVar8].v != '\0')))) {
          (*(pIVar5->super_Var).super_Branching._vptr_Branching[7])
                    (pIVar5,this,(ulong)(uVar13 - 1),1);
        }
        iVar8 = this->t;
        if ((((pIVar5->min).v <= iVar8) && (iVar8 <= (pIVar5->max).v)) &&
           ((pIVar5->vals == (Tchar *)0x0 || (pIVar5->vals[iVar8].v != '\0')))) {
          (*(pIVar5->super_Var).super_Branching._vptr_Branching[7])(pIVar5,this,(ulong)uVar13,8);
        }
        uVar11 = uVar11 + 1;
        uVar12 = this_00->sz;
        uVar13 = uVar13 + 2;
        uVar10 = local_3c;
      } while (uVar11 < uVar12);
    }
    pTVar1 = &this->second_s;
    pTVar2 = &this->first_t;
    local_50.x = pTVar2->v;
    local_50.sz = 4;
    local_50.pt = &pTVar2->v;
    vec<TrailElem>::push(&engine.trail,&local_50);
    pTVar2->v = uVar12 - uVar10;
    uVar10 = this_00->sz;
    uVar11 = 1;
    if (1 < (int)uVar10) {
      iVar8 = *(int *)&(this->super_Propagator).field_0x14;
      uVar11 = 1;
      do {
        pIVar5 = (this->xs).data[uVar11];
        if ((((pIVar5->min).v <= iVar8) && (iVar8 <= (pIVar5->max).v)) &&
           ((pIVar5->vals == (Tchar *)0x0 || (pIVar5->vals[iVar8].v != '\0')))) goto LAB_00170c7e;
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
      uVar11 = (ulong)uVar10;
    }
LAB_00170c7e:
    local_50.x = pTVar1->v;
    local_50.sz = 4;
    local_50.pt = &pTVar1->v;
    vec<TrailElem>::push(&engine.trail,&local_50);
    pTVar1->v = (int)uVar11;
    if ((int)uVar11 < pTVar2->v) {
      return;
    }
    pIVar5 = (this->xs).data[(uint)(this->first_s).v];
    iVar8 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[0x10])
                      (pIVar5,(long)*(int *)&(this->super_Propagator).field_0x14,0,1);
    pTVar14 = local_38;
    if ((char)iVar8 == '\0') {
      puts("=====UNSATISFIABLE=====");
      printf("%% Top level failure!\n");
      exit(0);
    }
  }
  local_50.x = (int)pTVar14->v;
  local_50.sz = 1;
  local_50.pt = (int *)pTVar14;
  vec<TrailElem>::push(&engine.trail,&local_50);
  pTVar14->v = '\x01';
  return;
}

Assistant:

value_precede(int _s, int _t, vec<IntVar*>& vs) : s(_s), t(_t), satisfied(0) {
		// Find the first possible occurrence of s.
		unsigned int ii = 0;
		// Can't do remVal before initialization.
		for (; ii < vs.size(); ii++) {
			if (vs[ii]->indomain(t)) {
				int_rel(vs[ii], IRT_NE, t);
			}
			if (vs[ii]->indomain(s)) {
				break;
			}
		}

		// Now copy the remaining values.
		bool t_seen = false;
		first_s = 0;
		for (; ii < vs.size(); ii++) {
			IntVar* x(vs[ii]);
			if (x->isFixed() && x->getVal() == s) {
				break;
			}

			if (!x->indomain(s) && !x->indomain(t)) {
				continue;
			}
			xs.push(x);

			if (x->isFixed() && x->getVal() == t) {
				t_seen = true;
				break;
			}
		}

		if (xs.size() <= 1) {
			satisfied = 1;
			return;
		}

		for (unsigned int ii = 0; ii < xs.size(); ii++) {
			IntVar* x(xs[ii]);
			x->specialiseToEL();
			if (x->indomain(s)) {
				x->attach(this, ii << 1, EVENT_C);
			}
			if (x->indomain(t)) {
				x->attach(this, (ii << 1) | 1, EVENT_F);
			}
		}

		first_t = xs.size() - static_cast<int>(t_seen);

		int si = 1;
		for (; si < static_cast<int>(xs.size()); ++si) {
			if (xs[si]->indomain(s)) {
				break;
			}
		}
		second_s = si;
		if (first_t <= second_s) {
			if (!xs[first_s]->setVal(s)) {
				TL_FAIL();
			}
			satisfied = 1;
		}
	}